

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::GetFileDependencies
          (cmBinUtilsMacOSMachOLinker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  FileInfo *local_c0;
  FileInfo *dep_file_info;
  undefined1 local_b0 [7];
  bool unique;
  string filename;
  bool local_79;
  undefined1 local_78 [7];
  bool resolved;
  string path;
  string *name;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  string *loaderPath_local;
  string *executablePath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(names);
  name = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(names);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name), bVar1) {
    path.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    bVar1 = cmRuntimeDependencyArchive::IsPreExcluded
                      ((this->super_cmBinUtilsLinker).Archive,(string *)path.field_2._8_8_);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_78);
      bVar1 = ResolveDependency(this,(string *)path.field_2._8_8_,executablePath,loaderPath,rpaths,
                                (string *)local_78,&local_79);
      if (bVar1) {
        if ((local_79 & 1U) == 0) {
          cmRuntimeDependencyArchive::AddUnresolvedPath
                    ((this->super_cmBinUtilsLinker).Archive,(string *)path.field_2._8_8_);
        }
        else {
          bVar1 = cmRuntimeDependencyArchive::IsPostExcluded
                            ((this->super_cmBinUtilsLinker).Archive,(string *)local_78);
          if ((!bVar1) &&
             (bVar1 = anon_unknown.dwarf_1163522::IsMissingSystemDylib((string *)local_78), !bVar1))
          {
            cmsys::SystemTools::GetFilenameName((string *)local_b0,(string *)local_78);
            local_c0 = GetFileInfo(this,(string *)local_78);
            if (local_c0 == (FileInfo *)0x0) {
              this_local._7_1_ = 0;
              filename.field_2._8_4_ = 1;
            }
            else {
              this_00 = (this->super_cmBinUtilsLinker).Archive;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_d8,&local_c0->rpaths);
              cmRuntimeDependencyArchive::AddResolvedPath
                        (this_00,(string *)local_b0,(string *)local_78,
                         (bool *)((long)&dep_file_info + 7),&local_d8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_d8);
              if (((dep_file_info._7_1_ & 1) == 0) ||
                 (bVar1 = ScanDependencies(this,(string *)local_78,&local_c0->libs,&local_c0->rpaths
                                           ,executablePath), bVar1)) {
                filename.field_2._8_4_ = 0;
              }
              else {
                this_local._7_1_ = 0;
                filename.field_2._8_4_ = 1;
              }
            }
            std::__cxx11::string::~string((string *)local_b0);
            if (filename.field_2._8_4_ != 0) goto LAB_007e8ea7;
          }
        }
        filename.field_2._8_4_ = 0;
      }
      else {
        this_local._7_1_ = 0;
        filename.field_2._8_4_ = 1;
      }
LAB_007e8ea7:
      std::__cxx11::string::~string((string *)local_78);
      if (filename.field_2._8_4_ != 0) goto LAB_007e8edf;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_007e8edf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::GetFileDependencies(
  std::vector<std::string> const& names, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths)
{
  for (std::string const& name : names) {
    if (!this->Archive->IsPreExcluded(name)) {
      std::string path;
      bool resolved;
      if (!this->ResolveDependency(name, executablePath, loaderPath, rpaths,
                                   path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path) &&
            !IsMissingSystemDylib(path)) {
          auto filename = cmSystemTools::GetFilenameName(path);
          bool unique;
          const FileInfo* dep_file_info = this->GetFileInfo(path);
          if (dep_file_info == nullptr) {
            return false;
          }

          this->Archive->AddResolvedPath(filename, path, unique,
                                         dep_file_info->rpaths);
          if (unique &&
              !this->ScanDependencies(path, dep_file_info->libs,
                                      dep_file_info->rpaths, executablePath)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(name);
      }
    }
  }

  return true;
}